

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_compiler.hpp
# Opt level: O2

string_type * __thiscall
boost::xpressive::
regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
::parse_literal<char_const*>
          (string_type *__return_storage_ptr__,
          regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
          *this,char **begin,char *end)

{
  char cVar1;
  size_type sVar2;
  bool bVar3;
  compiler_token_type cVar4;
  char *pcVar5;
  escape_value eVar6;
  char *tmp;
  regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
  *local_58;
  regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
  *local_50;
  quant_spec local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  pcVar5 = *begin;
  tmp = pcVar5 + 1;
  *begin = tmp;
  local_50 = this + 8;
  local_58 = this;
  do {
    if (tmp == end) {
      return __return_storage_ptr__;
    }
    local_48.greedy_ = false;
    local_48.min_ = 0;
    local_48.max_ = 0;
    local_48.hidden_mark_count_ = (size_t *)local_50;
    bVar3 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
            ::get_quant_spec<char_const*>
                      ((compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                        *)(this + 0x10),&tmp,end,&local_48);
    if (bVar3) {
      sVar2 = __return_storage_ptr__->_M_string_length;
      if (sVar2 == 1) {
        return __return_storage_ptr__;
      }
      *begin = pcVar5;
      std::__cxx11::string::erase
                (__return_storage_ptr__,(__return_storage_ptr__->_M_dataplus)._M_p + (sVar2 - 1));
      return __return_storage_ptr__;
    }
    cVar4 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
            ::get_token<char_const*>
                      ((compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                        *)(this + 0x10),&tmp,end);
    if (cVar4 == token_literal) {
      cVar1 = *tmp;
      tmp = tmp + 1;
      std::__cxx11::string::insert
                (__return_storage_ptr__,
                 (__return_storage_ptr__->_M_dataplus)._M_p +
                 __return_storage_ptr__->_M_string_length,(int)cVar1);
    }
    else {
      if (cVar4 != token_escape) {
        return __return_storage_ptr__;
      }
      eVar6 = parse_escape<char_const*>(local_58,&tmp,end);
      if (eVar6._8_8_ >> 0x20 != 0) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::insert
                (__return_storage_ptr__,
                 (__return_storage_ptr__->_M_dataplus)._M_p +
                 __return_storage_ptr__->_M_string_length,(int)eVar6.ch_);
    }
    pcVar5 = *begin;
    *begin = tmp;
  } while( true );
}

Assistant:

string_type parse_literal(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        BOOST_ASSERT(begin != end);
        BOOST_ASSERT(token_literal == this->traits_.get_token(begin, end));
        escape_value esc = { 0, 0, 0, detail::escape_char };
        string_type literal(1, *begin);

        for(FwdIter prev = begin, tmp = ++begin; begin != end; prev = begin, begin = tmp)
        {
            detail::quant_spec spec = { 0, 0, false, &this->hidden_mark_count_ };
            if(this->traits_.get_quant_spec(tmp, end, spec))
            {
                if(literal.size() != 1)
                {
                    begin = prev;
                    literal.erase(boost::prior(literal.end()));
                }
                return literal;
            }
            else switch(this->traits_.get_token(tmp, end))
            {
            case token_escape:
                esc = this->parse_escape(tmp, end);
                if(detail::escape_char != esc.type_) return literal;
                literal.insert(literal.end(), esc.ch_);
                break;
            case token_literal:
                literal.insert(literal.end(), *tmp++);
                break;
            default:
                return literal;
            }
        }

        return literal;
    }